

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

RTCSubdivisionMode embree::parseSubdivMode(Ref<embree::XML> *xml)

{
  XML *this;
  int iVar1;
  runtime_error *this_00;
  RTCSubdivisionMode RVar2;
  string subdiv_mode;
  string local_60;
  string local_40;
  
  this = xml->ptr;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"subdiv_mode","");
  XML::parm(&local_60,this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar1 == 0) {
    RVar2 = RTC_SUBDIVISION_MODE_NO_BOUNDARY;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_60);
    RVar2 = RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_60);
      if (iVar1 == 0) {
        RVar2 = RTC_SUBDIVISION_MODE_PIN_CORNERS;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_60);
        if (iVar1 == 0) {
          RVar2 = RTC_SUBDIVISION_MODE_PIN_BOUNDARY;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_60);
          if (iVar1 == 0) {
            RVar2 = RTC_SUBDIVISION_MODE_PIN_ALL;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&local_60);
            if (iVar1 != 0) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_40,"invalid subdivision mode: ",&local_60);
              std::runtime_error::runtime_error(this_00,(string *)&local_40);
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return RVar2;
}

Assistant:

Vec3f getVec3fa() const { return Vec3fa(f[0],f[1],f[2]); }